

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

void psnrCharts(TRIPLEYCbCr **mrxYCbCr,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  FILE *pFVar1;
  TRIPLEBYTES **ppTVar2;
  double dVar3;
  double psnr_1;
  double prob_1;
  double prob;
  TRIPLEYCbCr **mrxImpulseNoize;
  FILE *file2;
  double psnr;
  int sigma_1;
  int sigma;
  TRIPLEYCbCr **mrxGauseNoize;
  FILE *file;
  int w;
  int h;
  int step;
  int max;
  int min;
  TRIPLEYCbCr **mrxYCbCr_local;
  BITMAPFILEHEADER bmFile_local;
  
  pFVar1 = fopen("lab2/noize/chartPSNRGause/psnr.csv","w");
  for (psnr._4_4_ = 1; (int)psnr._4_4_ < 0x32; psnr._4_4_ = psnr._4_4_ + 1) {
    fprintf(pFVar1,"%d,",(ulong)psnr._4_4_);
  }
  fprintf(pFVar1,"\n");
  for (psnr._0_4_ = 1; (int)psnr._0_4_ < 0x32; psnr._0_4_ = psnr._0_4_ + 1) {
    ppTVar2 = gause_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,
                          (double)(int)psnr._0_4_,0);
    dVar3 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n",dVar3,(ulong)psnr._0_4_);
    fprintf(pFVar1,"%4.2f,",dVar3);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
  }
  fclose(pFVar1);
  pFVar1 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv","w");
  for (prob_1 = 0.1; prob_1 <= 1.0; prob_1 = prob_1 + 0.1) {
    fprintf(pFVar1,"%4.2f,",prob_1);
  }
  fprintf(pFVar1,"\n");
  for (psnr_1 = 0.1; psnr_1 <= 1.0; psnr_1 = psnr_1 + 0.1) {
    ppTVar2 = impulse_noise((TRIPLEBYTES **)mrxYCbCr,bmInfo.biHeight,bmInfo.biWidth,0,psnr_1 / 2.0,
                            psnr_1 / 2.0);
    dVar3 = getPSNR((TRIPLEBYTES **)mrxYCbCr,ppTVar2,0,0,bmInfo.biHeight,bmInfo.biWidth,0);
    printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n",psnr_1,dVar3);
    fprintf(pFVar1,"%4.2f,",dVar3);
    clear_memory((TRIPLEYCbCr **)ppTVar2,bmInfo.biHeight);
  }
  fclose(pFVar1);
  return;
}

Assistant:

void psnrCharts(TRIPLEYCbCr **mrxYCbCr, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int min = 1;
    int max = 50;
    int step = 1;
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    FILE *file = fopen("lab2/noize/chartPSNRGause/psnr.csv", "w");
    TRIPLEYCbCr **mrxGauseNoize;
    for (int sigma = min; sigma < max; sigma += step) {
        fprintf(file, "%d,", sigma);
    }
    fprintf(file, "\n");
    for (int sigma = min; sigma < max; sigma += step) {
        mrxGauseNoize = (TRIPLEYCbCr **) gause_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                     bmInfo.biWidth, sigma, COMPONENT_Y);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxGauseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("sigma: %d\tPSNR[gauseNoize ; origin ] - %f\n", sigma, psnr);
        fprintf(file, "%4.2f,", psnr);
        clear_memory(mrxGauseNoize, h);
    }
    fclose(file);

    FILE *file2 = fopen("lab2/noize/chartPSNRImpulse/psnr.csv", "w");
    TRIPLEYCbCr **mrxImpulseNoize;
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        fprintf(file2, "%4.2f,", prob);
    }
    fprintf(file2, "\n");
    for (double prob = 0.1; prob <= 1; prob += 0.1) {
        mrxImpulseNoize = (TRIPLEYCbCr **) impulse_noise((TRIPLEBYTES **) mrxYCbCr, bmInfo.biHeight,
                                                         bmInfo.biWidth, COMPONENT_Y, prob / 2, prob / 2);
        //printf("get noize\n");
        double psnr = getPSNR((TRIPLEBYTES **) mrxYCbCr, (TRIPLEBYTES **) mrxImpulseNoize, 0, 0, h, w,
                              COMPONENT_Y);
        printf("prob: %f\tPSNR[gauseNoize ; origin ] - %f\n", prob, psnr);
        fprintf(file2, "%4.2f,", psnr);
        clear_memory(mrxImpulseNoize, h);
    }
    fclose(file2);
}